

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::_OnChangedTextureID(ImDrawList *this)

{
  int iVar1;
  ImDrawCmd *pIVar2;
  int iVar3;
  
  pIVar2 = (this->CmdBuffer).Data;
  iVar1 = (this->CmdBuffer).Size;
  if ((pIVar2[(long)iVar1 + -1].ElemCount != 0) &&
     (pIVar2[(long)iVar1 + -1].TextureId != (this->_CmdHeader).TextureId)) {
    AddDrawCmd(this);
    return;
  }
  if (pIVar2[(long)iVar1 + -1].UserCallback != (ImDrawCallback)0x0) {
    __assert_fail("curr_cmd->UserCallback == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_draw.cpp"
                  ,0x20b,"void ImDrawList::_OnChangedTextureID()");
  }
  if ((1 < iVar1) && (pIVar2[(long)iVar1 + -1].ElemCount == 0)) {
    iVar3 = bcmp(&this->_CmdHeader,pIVar2 + (long)iVar1 + -2,0x1c);
    if ((iVar3 == 0) && (pIVar2[(long)iVar1 + -2].UserCallback == (ImDrawCallback)0x0)) {
      ImVector<ImDrawCmd>::pop_back(&this->CmdBuffer);
      return;
    }
  }
  pIVar2[(long)iVar1 + -1].TextureId = (this->_CmdHeader).TextureId;
  return;
}

Assistant:

void ImDrawList::_OnChangedTextureID()
{
    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount != 0 && curr_cmd->TextureId != _CmdHeader.TextureId)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (curr_cmd->ElemCount == 0 && CmdBuffer.Size > 1 && ImDrawCmd_HeaderCompare(&_CmdHeader, prev_cmd) == 0 && prev_cmd->UserCallback == NULL)
    {
        CmdBuffer.pop_back();
        return;
    }

    curr_cmd->TextureId = _CmdHeader.TextureId;
}